

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumFloat(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  VRDatumFloat::VRDatumFloat((VRDatumFloat *)pValue,*pData);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumFloat(void *pData) {
  VRDatumFloat *obj = new VRDatumFloat(*static_cast<VRFloat *>(pData));
  return VRDatumPtr(obj);
}